

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<std::array<float,_2UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<std::array<float,2ul>>
          (optional<std::array<float,_2UL>_> *__return_storage_ptr__,PrimVar *this)

{
  optional<std::array<float,_2UL>_> local_1c;
  
  get_value<std::array<float,2ul>>(&local_1c,this);
  __return_storage_ptr__->has_value_ = local_1c.has_value_;
  if (local_1c.has_value_ == true) {
    __return_storage_ptr__->contained = local_1c.contained;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }